

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode create_conn_helper_init_proxy(Curl_easy *data,connectdata *conn)

{
  _Bool _Var1;
  curl_proxytype proxytype;
  bool local_59;
  char *local_58;
  char *pcStack_40;
  curl_proxytype ptype;
  char *p;
  char *pcStack_30;
  CURLcode result;
  char *no_proxy;
  char *socksproxy;
  char *proxy;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  socksproxy = (char *)0x0;
  no_proxy = (char *)0x0;
  pcStack_30 = (char *)0x0;
  p._4_4_ = CURLE_OK;
  if ((((ulong)conn->bits >> 2 & 1) == 0) ||
     (p._4_4_ = parse_proxy_auth(data,conn), p._4_4_ == CURLE_OK)) {
    if (((data->set).str[0x26] == (char *)0x0) ||
       (socksproxy = (*Curl_cstrdup)((data->set).str[0x26]), socksproxy != (char *)0x0)) {
      if (((data->set).str[0x27] == (char *)0x0) ||
         (no_proxy = (*Curl_cstrdup)((data->set).str[0x27]), no_proxy != (char *)0x0)) {
        if ((data->set).str[0x32] == (char *)0x0) {
          pcStack_40 = "no_proxy";
          pcStack_30 = curl_getenv("no_proxy");
          if (pcStack_30 == (char *)0x0) {
            pcStack_40 = "NO_PROXY";
            pcStack_30 = curl_getenv("NO_PROXY");
          }
          if ((((pcStack_30 != (char *)0x0) && (data != (Curl_easy *)0x0)) &&
              ((*(ulong *)&(data->set).field_0x894 >> 0x1e & 1) != 0)) &&
             (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))
             ) {
            Curl_infof(data,"Uses proxy env variable %s == \'%s\'",pcStack_40,pcStack_30);
          }
        }
        if ((data->set).str[0x32] == (char *)0x0) {
          local_58 = pcStack_30;
        }
        else {
          local_58 = (data->set).str[0x32];
        }
        _Var1 = Curl_check_noproxy((conn->host).name,local_58);
        if (_Var1) {
          (*Curl_cfree)(socksproxy);
          socksproxy = (char *)0x0;
          (*Curl_cfree)(no_proxy);
          no_proxy = (char *)0x0;
        }
        else if ((socksproxy == (char *)0x0) && (no_proxy == (char *)0x0)) {
          socksproxy = detect_proxy(data,conn);
        }
        (*Curl_cfree)(pcStack_30);
        if ((socksproxy != (char *)0x0) && (conn->unix_domain_socket != (char *)0x0)) {
          (*Curl_cfree)(socksproxy);
          socksproxy = (char *)0x0;
        }
        if ((socksproxy != (char *)0x0) &&
           ((*socksproxy == '\0' || ((conn->handler->flags & 0x10) != 0)))) {
          (*Curl_cfree)(socksproxy);
          socksproxy = (char *)0x0;
        }
        if ((no_proxy != (char *)0x0) &&
           ((*no_proxy == '\0' || ((conn->handler->flags & 0x10) != 0)))) {
          (*Curl_cfree)(no_proxy);
          no_proxy = (char *)0x0;
        }
        if ((socksproxy == (char *)0x0) && (no_proxy == (char *)0x0)) {
          conn->bits = (ConnectBits)((ulong)conn->bits & 0xfffffffffffffffd);
          conn->bits = (ConnectBits)((ulong)conn->bits & 0xfffffffffffffffe);
        }
        else {
          proxytype = (curl_proxytype)(conn->http_proxy).proxytype;
          if (socksproxy != (char *)0x0) {
            p._4_4_ = parse_proxy(data,conn,socksproxy,proxytype);
            (*Curl_cfree)(socksproxy);
            socksproxy = (char *)0x0;
            if (p._4_4_ != CURLE_OK) goto LAB_0019c4ce;
          }
          if (no_proxy != (char *)0x0) {
            p._4_4_ = parse_proxy(data,conn,no_proxy,proxytype);
            (*Curl_cfree)(no_proxy);
            no_proxy = (char *)0x0;
            if (p._4_4_ != CURLE_OK) goto LAB_0019c4ce;
          }
          if ((conn->http_proxy).host.rawalloc == (char *)0x0) {
            conn->bits = (ConnectBits)((ulong)conn->bits & 0xfffffffffffffffe);
            conn->bits = (ConnectBits)((ulong)conn->bits & 0xfffffffffffffff7);
          }
          else {
            if ((conn->handler->protocol & 0xc0000003) == 0) {
              if (((conn->handler->flags & 0x800) == 0) || (((ulong)conn->bits >> 3 & 1) != 0)) {
                conn->bits = (ConnectBits)((ulong)conn->bits & 0xfffffffffffffff7 | 8);
              }
              else {
                conn->handler = &Curl_handler_http;
              }
            }
            conn->bits = (ConnectBits)((ulong)conn->bits & 0xfffffffffffffffe | 1);
          }
          if ((conn->socks_proxy).host.rawalloc == (char *)0x0) {
            conn->bits = (ConnectBits)((ulong)conn->bits & 0xfffffffffffffffd);
          }
          else {
            if (((conn->http_proxy).host.rawalloc == (char *)0x0) &&
               ((conn->socks_proxy).user == (char *)0x0)) {
              (conn->socks_proxy).user = (conn->http_proxy).user;
              (conn->http_proxy).user = (char *)0x0;
              (*Curl_cfree)((conn->socks_proxy).passwd);
              (conn->socks_proxy).passwd = (conn->http_proxy).passwd;
              (conn->http_proxy).passwd = (char *)0x0;
            }
            conn->bits = (ConnectBits)((ulong)conn->bits & 0xfffffffffffffffd | 2);
          }
        }
        local_59 = true;
        if (((ulong)conn->bits & 1) == 0) {
          local_59 = ((ulong)conn->bits >> 1 & 1) != 0;
        }
        conn->bits = (ConnectBits)((ulong)conn->bits & 0xffffffffffffffef | (ulong)local_59 << 4);
        if (((ulong)conn->bits >> 4 & 1) == 0) {
          conn->bits = (ConnectBits)((ulong)conn->bits & 0xffffffffffffffef);
          conn->bits = (ConnectBits)((ulong)conn->bits & 0xfffffffffffffffe);
          conn->bits = (ConnectBits)((ulong)conn->bits & 0xfffffffffffffffd);
          conn->bits = (ConnectBits)((ulong)conn->bits & 0xfffffffffffffffb);
          conn->bits = (ConnectBits)((ulong)conn->bits & 0xfffffffffffffff7);
          (conn->http_proxy).proxytype = '\0';
        }
      }
      else {
        Curl_failf(data,"memory shortage");
        p._4_4_ = CURLE_OUT_OF_MEMORY;
      }
    }
    else {
      Curl_failf(data,"memory shortage");
      p._4_4_ = CURLE_OUT_OF_MEMORY;
    }
  }
LAB_0019c4ce:
  (*Curl_cfree)(no_proxy);
  (*Curl_cfree)(socksproxy);
  return p._4_4_;
}

Assistant:

static CURLcode create_conn_helper_init_proxy(struct Curl_easy *data,
                                              struct connectdata *conn)
{
  char *proxy = NULL;
  char *socksproxy = NULL;
  char *no_proxy = NULL;
  CURLcode result = CURLE_OK;

  /*************************************************************
   * Extract the user and password from the authentication string
   *************************************************************/
  if(conn->bits.proxy_user_passwd) {
    result = parse_proxy_auth(data, conn);
    if(result)
      goto out;
  }

  /*************************************************************
   * Detect what (if any) proxy to use
   *************************************************************/
  if(data->set.str[STRING_PROXY]) {
    proxy = strdup(data->set.str[STRING_PROXY]);
    /* if global proxy is set, this is it */
    if(!proxy) {
      failf(data, "memory shortage");
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
  }

  if(data->set.str[STRING_PRE_PROXY]) {
    socksproxy = strdup(data->set.str[STRING_PRE_PROXY]);
    /* if global socks proxy is set, this is it */
    if(!socksproxy) {
      failf(data, "memory shortage");
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
  }

  if(!data->set.str[STRING_NOPROXY]) {
    const char *p = "no_proxy";
    no_proxy = curl_getenv(p);
    if(!no_proxy) {
      p = "NO_PROXY";
      no_proxy = curl_getenv(p);
    }
    if(no_proxy) {
      infof(data, "Uses proxy env variable %s == '%s'", p, no_proxy);
    }
  }

  if(Curl_check_noproxy(conn->host.name, data->set.str[STRING_NOPROXY] ?
                        data->set.str[STRING_NOPROXY] : no_proxy)) {
    Curl_safefree(proxy);
    Curl_safefree(socksproxy);
  }
#ifndef CURL_DISABLE_HTTP
  else if(!proxy && !socksproxy)
    /* if the host is not in the noproxy list, detect proxy. */
    proxy = detect_proxy(data, conn);
#endif /* CURL_DISABLE_HTTP */
  Curl_safefree(no_proxy);

#ifdef USE_UNIX_SOCKETS
  /* For the time being do not mix proxy and Unix domain sockets. See #1274 */
  if(proxy && conn->unix_domain_socket) {
    free(proxy);
    proxy = NULL;
  }
#endif

  if(proxy && (!*proxy || (conn->handler->flags & PROTOPT_NONETWORK))) {
    free(proxy);  /* Do not bother with an empty proxy string or if the
                     protocol does not work with network */
    proxy = NULL;
  }
  if(socksproxy && (!*socksproxy ||
                    (conn->handler->flags & PROTOPT_NONETWORK))) {
    free(socksproxy);  /* Do not bother with an empty socks proxy string or if
                          the protocol does not work with network */
    socksproxy = NULL;
  }

  /***********************************************************************
   * If this is supposed to use a proxy, we need to figure out the proxy host
   * name, proxy type and port number, so that we can reuse an existing
   * connection that may exist registered to the same proxy host.
   ***********************************************************************/
  if(proxy || socksproxy) {
    curl_proxytype ptype = (curl_proxytype)conn->http_proxy.proxytype;
    if(proxy) {
      result = parse_proxy(data, conn, proxy, ptype);
      Curl_safefree(proxy); /* parse_proxy copies the proxy string */
      if(result)
        goto out;
    }

    if(socksproxy) {
      result = parse_proxy(data, conn, socksproxy, ptype);
      /* parse_proxy copies the socks proxy string */
      Curl_safefree(socksproxy);
      if(result)
        goto out;
    }

    if(conn->http_proxy.host.rawalloc) {
#ifdef CURL_DISABLE_HTTP
      /* asking for an HTTP proxy is a bit funny when HTTP is disabled... */
      result = CURLE_UNSUPPORTED_PROTOCOL;
      goto out;
#else
      /* force this connection's protocol to become HTTP if compatible */
      if(!(conn->handler->protocol & PROTO_FAMILY_HTTP)) {
        if((conn->handler->flags & PROTOPT_PROXY_AS_HTTP) &&
           !conn->bits.tunnel_proxy)
          conn->handler = &Curl_handler_http;
        else
          /* if not converting to HTTP over the proxy, enforce tunneling */
          conn->bits.tunnel_proxy = TRUE;
      }
      conn->bits.httpproxy = TRUE;
#endif
    }
    else {
      conn->bits.httpproxy = FALSE; /* not an HTTP proxy */
      conn->bits.tunnel_proxy = FALSE; /* no tunneling if not HTTP */
    }

    if(conn->socks_proxy.host.rawalloc) {
      if(!conn->http_proxy.host.rawalloc) {
        /* once a socks proxy */
        if(!conn->socks_proxy.user) {
          conn->socks_proxy.user = conn->http_proxy.user;
          conn->http_proxy.user = NULL;
          free(conn->socks_proxy.passwd);
          conn->socks_proxy.passwd = conn->http_proxy.passwd;
          conn->http_proxy.passwd = NULL;
        }
      }
      conn->bits.socksproxy = TRUE;
    }
    else
      conn->bits.socksproxy = FALSE; /* not a socks proxy */
  }
  else {
    conn->bits.socksproxy = FALSE;
    conn->bits.httpproxy = FALSE;
  }
  conn->bits.proxy = conn->bits.httpproxy || conn->bits.socksproxy;

  if(!conn->bits.proxy) {
    /* we are not using the proxy after all... */
    conn->bits.proxy = FALSE;
    conn->bits.httpproxy = FALSE;
    conn->bits.socksproxy = FALSE;
    conn->bits.proxy_user_passwd = FALSE;
    conn->bits.tunnel_proxy = FALSE;
    /* CURLPROXY_HTTPS does not have its own flag in conn->bits, yet we need
       to signal that CURLPROXY_HTTPS is not used for this connection */
    conn->http_proxy.proxytype = CURLPROXY_HTTP;
  }

out:

  free(socksproxy);
  free(proxy);
  return result;
}